

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigDfs.c
# Opt level: O2

Vec_Ptr_t * Aig_ManDfsNodes(Aig_Man_t *p,Aig_Obj_t **ppNodes,int nNodes)

{
  Vec_Ptr_t *vNodes;
  ulong uVar1;
  Aig_Obj_t *pObj;
  ulong uVar2;
  
  Aig_ManIncrementTravId(p);
  p->pConst1->TravId = p->nTravIds;
  vNodes = Vec_PtrAlloc(p->nObjs[6] + p->nObjs[5]);
  uVar2 = 0;
  uVar1 = (ulong)(uint)nNodes;
  if (nNodes < 1) {
    uVar1 = uVar2;
  }
  for (; uVar1 != uVar2; uVar2 = uVar2 + 1) {
    pObj = ppNodes[uVar2];
    if ((*(uint *)&pObj->field_0x18 & 7) == 3) {
      pObj = (Aig_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe);
    }
    Aig_ManDfs_rec(p,pObj,vNodes);
  }
  return vNodes;
}

Assistant:

Vec_Ptr_t * Aig_ManDfsNodes( Aig_Man_t * p, Aig_Obj_t ** ppNodes, int nNodes )
{
    Vec_Ptr_t * vNodes;
//    Aig_Obj_t * pObj;
    int i;
    Aig_ManIncrementTravId( p );
    // mark constant and PIs
    Aig_ObjSetTravIdCurrent( p, Aig_ManConst1(p) );
//    Aig_ManForEachCi( p, pObj, i )
//        Aig_ObjSetTravIdCurrent( p, pObj );
    // go through the nodes
    vNodes = Vec_PtrAlloc( Aig_ManNodeNum(p) );
    for ( i = 0; i < nNodes; i++ )
        if ( Aig_ObjIsCo(ppNodes[i]) )
            Aig_ManDfs_rec( p, Aig_ObjFanin0(ppNodes[i]), vNodes );
        else
            Aig_ManDfs_rec( p, ppNodes[i], vNodes );
    return vNodes;
}